

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  archive *paVar2;
  Compress CVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  cmCPackLog *pcVar6;
  __node_base *p_Var7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  undefined8 *puVar13;
  _Rb_tree_node_base *p_Var14;
  ostream *poVar15;
  size_t sVar16;
  ulong *puVar17;
  ulong *puVar18;
  undefined7 in_register_00000031;
  undefined8 uVar19;
  archive *paVar20;
  _Alloc_hider _Var21;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  string localToplevel;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  long *local_5f0;
  long local_5e8;
  long local_5e0 [2];
  string local_5d0;
  _Rb_tree_node_base *local_5b0;
  _Rb_tree_node_base *local_5a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_5a0;
  undefined1 local_598 [112];
  ios_base local_528 [264];
  Deduplicator local_420;
  undefined1 local_378 [64];
  _Alloc_hider local_338;
  size_type local_330;
  undefined1 local_298 [112];
  ios_base local_228 [504];
  
  local_5a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5a0,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    p_Var14 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left;
    local_5a8 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var14 != local_5a8) {
      local_5b0 = (_Rb_tree_node_base *)&this->ArchiveFormat;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Packaging component group: ",0x1b);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent
                            );
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        pcVar6 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        uVar19 = local_598._0_8_;
        sVar16 = strlen((char *)local_598._0_8_);
        cmCPackLog::Log(pcVar6,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x14a,(char *)uVar19,sVar16);
        if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
          operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
        local_598._0_8_ = local_598 + 0x10;
        pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_598,pcVar4,
                   pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        plVar11 = (long *)std::__cxx11::string::append((char *)local_598);
        local_298._0_8_ = local_298 + 0x10;
        puVar18 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar18) {
          local_298._16_8_ = *puVar18;
          local_298._24_8_ = plVar11[3];
        }
        else {
          local_298._16_8_ = *puVar18;
          local_298._0_8_ = (ulong *)*plVar11;
        }
        local_298._8_8_ = plVar11[1];
        *plVar11 = (long)puVar18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        GetArchiveComponentFileName((string *)local_378,this,(string *)(p_Var14 + 1),true);
        paVar20 = (archive *)0xf;
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          paVar20 = (archive *)local_298._16_8_;
        }
        paVar2 = (archive *)((long)(uint *)local_378._8_8_ + local_298._8_8_);
        if (paVar20 < paVar2) {
          paVar20 = (archive *)0xf;
          if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
            paVar20 = (archive *)local_378._16_8_;
          }
          if (paVar20 < paVar2) goto LAB_001e009d;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_378,0,(char *)0x0,local_298._0_8_);
        }
        else {
LAB_001e009d:
          puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_298,local_378._0_8_)
          ;
        }
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar1) {
          local_5d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_5d0.field_2._8_8_ = puVar13[3];
          local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
        }
        else {
          local_5d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_5d0._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_5d0._M_string_length = puVar13[1];
        *puVar13 = paVar1;
        puVar13[1] = 0;
        paVar1->_M_local_buf[0] = '\0';
        if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
          operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
        }
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
          operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
        }
        local_420.Symlink._M_h._M_buckets = &local_420.Symlink._M_h._M_single_bucket;
        local_420.Symlink._M_h._M_bucket_count = 1;
        local_420.Symlink._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_420.Symlink._M_h._M_element_count = 0;
        local_420.Symlink._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_420.Symlink._M_h._M_rehash_policy._M_next_resize = 0;
        local_420.Symlink._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_420.Folders._M_h._M_buckets = &local_420.Folders._M_h._M_single_bucket;
        local_420.Folders._M_h._M_bucket_count = 1;
        local_420.Folders._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_420.Folders._M_h._M_element_count = 0;
        local_420.Folders._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_420.Folders._M_h._M_rehash_policy._M_next_resize = 0;
        local_420.Folders._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_420.Files._M_h._M_buckets = &local_420.Files._M_h._M_single_bucket;
        local_420.Files._M_h._M_bucket_count = 1;
        local_420.Files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_420.Files._M_h._M_element_count = 0;
        local_420.Files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_420.Files._M_h._M_rehash_policy._M_next_resize = 0;
        local_420.Files._M_h._M_single_bucket = (__node_base_ptr)0x0;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d0,false,true);
        iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                          (this,(ostringstream *)local_298);
        if (iVar9 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to generate Header for archive <",0x28);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">.",2);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar19 = local_378._0_8_;
          sVar16 = strlen((char *)local_378._0_8_);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x154,(char *)uVar19,sVar16);
          if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
          std::ios_base::~ios_base(local_528);
LAB_001e0e21:
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_420.Files._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_420.Folders._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_420);
          uVar19 = local_5d0.field_2._M_allocated_capacity;
          _Var21._M_p = local_5d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d0._M_dataplus._M_p == &local_5d0.field_2) {
            return 0;
          }
          goto LAB_001e11fc;
        }
        CVar3 = this->Compress;
        iVar9 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,(string *)local_5b0,0,
                   iVar9);
        bVar8 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
        if (!bVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to open archive <",0x19);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
          local_5f0 = local_5e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_5f0,local_5e8);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar11 = local_5f0;
          sVar16 = strlen((char *)local_5f0);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x154,(char *)plVar11,sVar16);
LAB_001e0ddf:
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
          std::ios_base::~ios_base(local_528);
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
          goto LAB_001e0e21;
        }
        if (local_330 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to create archive <",0x1b);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
          local_5f0 = local_5e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_5f0,local_5e8);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar11 = local_5f0;
          sVar16 = strlen((char *)local_5f0);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x154,(char *)plVar11,sVar16);
          goto LAB_001e0ddf;
        }
        p_Var5 = p_Var14[5]._M_left;
        for (p_Var12 = p_Var14[5]._M_parent; p_Var12 != p_Var5;
            p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_378,*(cmCPackComponent **)p_Var12,&local_420);
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_5a0,&local_5d0);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_420.Files._M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_420.Folders._M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_420);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,
                          (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
        }
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != local_5a8);
    }
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    p_Var14 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
               _M_header;
    if (p_Var12 != p_Var14) {
      puVar18 = (ulong *)(local_298 + 0x10);
      local_5a8 = (_Rb_tree_node_base *)&this->ArchiveFormat;
      local_5b0 = p_Var14;
      do {
        if (*(long *)(p_Var12 + 4) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"Component <",0xb)
          ;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,*(char **)(p_Var12 + 2),
                               (long)p_Var12[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar19 = local_598._0_8_;
          sVar16 = strlen((char *)local_598._0_8_);
          cmCPackLog::Log(pcVar6,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x167,(char *)uVar19,sVar16);
          p_Var7 = &local_420.Symlink._M_h._M_before_begin;
          if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
            operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
          std::ios_base::~ios_base(local_228);
          local_298._0_8_ = puVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"CPACK_TEMPORARY_DIRECTORY","");
          psVar10 = (string *)
                    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_298);
          if (psVar10 == (string *)0x0) {
            psVar10 = &cmValue::Empty_abi_cxx11_;
          }
          pcVar4 = (psVar10->_M_dataplus)._M_p;
          local_420.Symlink._M_h._M_buckets = &p_Var7->_M_nxt;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_420,pcVar4,pcVar4 + psVar10->_M_string_length);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
          pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5d0,pcVar4,
                     pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var12 + 1));
          std::__cxx11::string::_M_append((char *)&local_420,local_298._0_8_);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          GetArchiveComponentFileName((string *)local_598,this,(string *)(p_Var12 + 1),false);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x8ca7d1);
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_298._16_8_ = *puVar17;
            local_298._24_8_ = plVar11[3];
            local_298._0_8_ = puVar18;
          }
          else {
            local_298._16_8_ = *puVar17;
            local_298._0_8_ = (ulong *)*plVar11;
          }
          local_298._8_8_ = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_5d0,local_298._0_8_);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
            operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
          }
          cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
          cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d0,false,true);
          iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                            (this,(cmGeneratedFileStream *)local_298);
          if (iVar9 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_598,"Problem to generate Header for archive <",0x28);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                                 local_5d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,">.",2);
            std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            pcVar6 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            uVar19 = local_378._0_8_;
            sVar16 = strlen((char *)local_378._0_8_);
            cmCPackLog::Log(pcVar6,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x171,(char *)uVar19,sVar16);
            if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
              operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
            std::ios_base::~ios_base(local_528);
          }
          else {
            CVar3 = this->Compress;
            iVar9 = GetThreadCount(this);
            cmArchiveWrite::cmArchiveWrite
                      ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,(string *)local_5a8,0,
                       iVar9);
            bVar8 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
            if (bVar8) {
              if (local_330 == 0) {
                addOneComponentToArchive
                          (this,(cmArchiveWrite *)local_378,(cmCPackComponent *)(p_Var12 + 2),
                           (Deduplicator *)0x0);
                cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_5a0,&local_5d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                  operator_delete(local_5d0._M_dataplus._M_p,
                                  (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
                }
                p_Var14 = local_5b0;
                if ((__node_base *)local_420.Symlink._M_h._M_buckets != p_Var7) {
                  operator_delete(local_420.Symlink._M_h._M_buckets,
                                  (ulong)((long)&(local_420.Symlink._M_h._M_before_begin._M_nxt)->
                                                 _M_nxt + 1));
                  p_Var14 = local_5b0;
                }
                goto LAB_001e070e;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_598,"Problem to create archive <",0x1b);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                                   local_5d0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
              local_5f0 = local_5e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(char *)local_5f0,local_5e8);
              std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
              std::ostream::put((char)poVar15);
              std::ostream::flush();
              if (local_5f0 != local_5e0) {
                operator_delete(local_5f0,local_5e0[0] + 1);
              }
              pcVar6 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              plVar11 = local_5f0;
              sVar16 = strlen((char *)local_5f0);
              cmCPackLog::Log(pcVar6,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0x171,(char *)plVar11,sVar16);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_598,"Problem to open archive <",0x19);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                                   local_5d0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
              local_5f0 = local_5e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(char *)local_5f0,local_5e8);
              std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
              std::ostream::put((char)poVar15);
              std::ostream::flush();
              if (local_5f0 != local_5e0) {
                operator_delete(local_5f0,local_5e0[0] + 1);
              }
              pcVar6 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              plVar11 = local_5f0;
              sVar16 = strlen((char *)local_5f0);
              cmCPackLog::Log(pcVar6,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0x171,(char *)plVar11,sVar16);
            }
            if (local_5f0 != local_5e0) {
              operator_delete(local_5f0,local_5e0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
            std::ios_base::~ios_base(local_528);
            cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
            operator_delete(local_5d0._M_dataplus._M_p,
                            (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
          }
          uVar19 = local_420.Symlink._M_h._M_before_begin._M_nxt;
          _Var21._M_p = (pointer)local_420.Symlink._M_h._M_buckets;
          if ((__node_base *)local_420.Symlink._M_h._M_buckets == p_Var7) {
            return 0;
          }
          goto LAB_001e11fc;
        }
LAB_001e070e:
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != p_Var14);
    }
  }
  else {
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_5a8 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var12 != local_5a8) {
      puVar18 = (ulong *)(local_298 + 0x10);
      local_5b0 = (_Rb_tree_node_base *)&this->ArchiveFormat;
      do {
        local_298._0_8_ = puVar18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"CPACK_TEMPORARY_DIRECTORY","");
        psVar10 = (string *)
                  cmCPackGenerator::GetOption
                            (&this->super_cmCPackGenerator,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_298);
        if (psVar10 == (string *)0x0) {
          psVar10 = &cmValue::Empty_abi_cxx11_;
        }
        local_420.Symlink._M_h._M_buckets = &local_420.Symlink._M_h._M_before_begin._M_nxt;
        pcVar4 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_420,pcVar4,pcVar4 + psVar10->_M_string_length);
        if ((ulong *)local_298._0_8_ != puVar18) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
        pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5d0,pcVar4,
                   pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var12 + 1));
        std::__cxx11::string::_M_append((char *)&local_420,local_298._0_8_);
        if ((ulong *)local_298._0_8_ != puVar18) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        GetArchiveComponentFileName((string *)local_598,this,(string *)(p_Var12 + 1),false);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x8ca7d1);
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_298._16_8_ = *puVar17;
          local_298._24_8_ = plVar11[3];
          local_298._0_8_ = puVar18;
        }
        else {
          local_298._16_8_ = *puVar17;
          local_298._0_8_ = (ulong *)*plVar11;
        }
        local_298._8_8_ = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_5d0,local_298._0_8_);
        if ((ulong *)local_298._0_8_ != puVar18) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
          operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d0,false,true);
        iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_298);
        if (iVar9 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to generate Header for archive <",0x28);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">.",2);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar19 = local_378._0_8_;
          sVar16 = strlen((char *)local_378._0_8_);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x186,(char *)uVar19,sVar16);
          if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
          std::ios_base::~ios_base(local_528);
          goto LAB_001e0c92;
        }
        CVar3 = this->Compress;
        iVar9 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,(string *)local_5b0,0,
                   iVar9);
        bVar8 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
        if (!bVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to open archive <",0x19);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
          local_5f0 = local_5e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_5f0,local_5e8);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar11 = local_5f0;
          sVar16 = strlen((char *)local_5f0);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x186,(char *)plVar11,sVar16);
LAB_001e0c50:
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
          std::ios_base::~ios_base(local_528);
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
LAB_001e0c92:
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
            operator_delete(local_5d0._M_dataplus._M_p,
                            (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
          }
          uVar19 = local_420.Symlink._M_h._M_before_begin._M_nxt;
          _Var21._M_p = (pointer)local_420.Symlink._M_h._M_buckets;
          if ((__node_base *)local_420.Symlink._M_h._M_buckets !=
              &local_420.Symlink._M_h._M_before_begin) {
LAB_001e11fc:
            operator_delete(_Var21._M_p,(ulong)((long)&((_Hash_node_base *)uVar19)->_M_nxt + 1));
          }
          return 0;
        }
        if (local_330 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_598,"Problem to create archive <",0x1b);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_598,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,">, ERROR = ",0xb);
          local_5f0 = local_5e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f0,local_338._M_p,local_338._M_p + local_330);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_5f0,local_5e8);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (local_5f0 != local_5e0) {
            operator_delete(local_5f0,local_5e0[0] + 1);
          }
          pcVar6 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar11 = local_5f0;
          sVar16 = strlen((char *)local_5f0);
          cmCPackLog::Log(pcVar6,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x186,(char *)plVar11,sVar16);
          goto LAB_001e0c50;
        }
        addOneComponentToArchive
                  (this,(cmArchiveWrite *)local_378,(cmCPackComponent *)(p_Var12 + 2),
                   (Deduplicator *)0x0);
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_5a0,&local_5d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,
                          (ulong)(local_5d0.field_2._M_allocated_capacity + 1));
        }
        if ((__node_base *)local_420.Symlink._M_h._M_buckets !=
            &local_420.Symlink._M_h._M_before_begin) {
          operator_delete(local_420.Symlink._M_h._M_buckets,
                          (ulong)((long)&(local_420.Symlink._M_h._M_before_begin._M_nxt)->_M_nxt + 1
                                 ));
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != local_5a8);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  this->packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(this->toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      Deduplicator deduplicator;

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, comp, &deduplicator);
        }
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(this->toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, &(comp.second), nullptr);
        }
        // add the generated package to package file names list
        this->packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(this->toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        this->addOneComponentToArchive(archive, &(comp.second), nullptr);
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}